

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

int __thiscall QWizardPage::nextId(QWizardPage *this)

{
  long lVar1;
  _Rb_tree_node_base *p_Var2;
  byte bVar3;
  _Rb_tree_node_base *p_Var4;
  
  lVar1 = *(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600);
  if (lVar1 != 0) {
    lVar1 = *(long *)(*(long *)(lVar1 + 8) + 0x2e0);
    if (lVar1 == 0) {
      p_Var2 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var2 = *(_Rb_tree_node_base **)(lVar1 + 0x20);
    }
    p_Var4 = (_Rb_tree_node_base *)(lVar1 + 0x10);
    if (lVar1 == 0) {
      p_Var4 = (_Rb_tree_node_base *)0x0;
    }
    bVar3 = 0;
    for (; p_Var2 != p_Var4; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      if ((p_Var2[1]._M_parent != (_Base_ptr)this) && (!(bool)(bVar3 ^ 1))) {
        return p_Var2[1]._M_color;
      }
      bVar3 = bVar3 | p_Var2[1]._M_parent == (_Base_ptr)this;
    }
  }
  return -1;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }